

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieanimation.cpp
# Opt level: O0

future<rlottie::Surface> __thiscall
RenderTaskScheduler::process(RenderTaskScheduler *this,SharedRenderTask *task)

{
  bool bVar1;
  __int_type_conflict _Var2;
  future<rlottie::Surface> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  TaskQueue<std::shared_ptr<RenderTask>_> *in_RSI;
  element_type *in_RDI;
  future<rlottie::Surface> fVar4;
  uint n;
  __int_type_conflict i;
  type *receiver;
  element_type *task_00;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar5;
  
  task_00 = in_RDI;
  std::__shared_ptr_access<RenderTask,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<RenderTask,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1a52bf);
  std::future<rlottie::Surface>::future((future<rlottie::Surface> *)in_RDI,in_RDX);
  _Var2 = std::__atomic_base<unsigned_int>::operator++
                    ((__atomic_base<unsigned_int> *)
                     &(in_RSI->_q).
                      super__Deque_base<std::shared_ptr<RenderTask>,_std::allocator<std::shared_ptr<RenderTask>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first,0);
  _Var3._M_pi = extraout_RDX;
  for (iVar5 = 0;
      iVar5 != *(int *)&(in_RSI->_q).
                        super__Deque_base<std::shared_ptr<RenderTask>,_std::allocator<std::shared_ptr<RenderTask>_>_>
                        ._M_impl.super__Deque_impl_data._M_map; iVar5 = iVar5 + 1) {
    std::
    vector<TaskQueue<std::shared_ptr<RenderTask>_>,_std::allocator<TaskQueue<std::shared_ptr<RenderTask>_>_>_>
    ::operator[]((vector<TaskQueue<std::shared_ptr<RenderTask>_>,_std::allocator<TaskQueue<std::shared_ptr<RenderTask>_>_>_>
                  *)&(in_RSI->_q).
                     super__Deque_base<std::shared_ptr<RenderTask>,_std::allocator<std::shared_ptr<RenderTask>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_last,
                 (ulong)(_Var2 + iVar5) %
                 (ulong)*(uint *)&(in_RSI->_q).
                                  super__Deque_base<std::shared_ptr<RenderTask>,_std::allocator<std::shared_ptr<RenderTask>_>_>
                                  ._M_impl.super__Deque_impl_data._M_map);
    bVar1 = TaskQueue<std::shared_ptr<RenderTask>_>::try_push
                      ((TaskQueue<std::shared_ptr<RenderTask>_> *)
                       CONCAT44(iVar5,in_stack_ffffffffffffffd8),(shared_ptr<RenderTask> *)in_RSI);
    _Var3._M_pi = extraout_RDX_00;
    if (bVar1) goto LAB_001a538a;
  }
  if (*(int *)&(in_RSI->_q).
               super__Deque_base<std::shared_ptr<RenderTask>,_std::allocator<std::shared_ptr<RenderTask>_>_>
               ._M_impl.super__Deque_impl_data._M_map != 0) {
    std::
    vector<TaskQueue<std::shared_ptr<RenderTask>_>,_std::allocator<TaskQueue<std::shared_ptr<RenderTask>_>_>_>
    ::operator[]((vector<TaskQueue<std::shared_ptr<RenderTask>_>,_std::allocator<TaskQueue<std::shared_ptr<RenderTask>_>_>_>
                  *)&(in_RSI->_q).
                     super__Deque_base<std::shared_ptr<RenderTask>,_std::allocator<std::shared_ptr<RenderTask>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_last,
                 (ulong)_Var2 %
                 (ulong)*(uint *)&(in_RSI->_q).
                                  super__Deque_base<std::shared_ptr<RenderTask>,_std::allocator<std::shared_ptr<RenderTask>_>_>
                                  ._M_impl.super__Deque_impl_data._M_map);
    TaskQueue<std::shared_ptr<RenderTask>_>::push(in_RSI,(shared_ptr<RenderTask> *)task_00);
    _Var3._M_pi = extraout_RDX_01;
  }
LAB_001a538a:
  fVar4.super___basic_future<rlottie::Surface>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  fVar4.super___basic_future<rlottie::Surface>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (future<rlottie::Surface>)
         fVar4.super___basic_future<rlottie::Surface>._M_state.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::future<Surface> process(SharedRenderTask task)
    {
        auto receiver = std::move(task->receiver);
        auto i = _index++;

        for (unsigned n = 0; n != _count; ++n) {
            if (_q[(i + n) % _count].try_push(std::move(task))) return receiver;
        }

        if (_count > 0) {
            _q[i % _count].push(std::move(task));
        }

        return receiver;
    }